

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O1

void __thiscall
amrex::EBCellFlagFab::EBCellFlagFab
          (EBCellFlagFab *this,EBCellFlagFab *rhs,MakeType make_type,int scomp,int ncomp)

{
  _Rb_tree_header *p_Var1;
  
  BaseFab<amrex::EBCellFlag>::BaseFab
            (&this->super_BaseFab<amrex::EBCellFlag>,&rhs->super_BaseFab<amrex::EBCellFlag>,
             make_type,scomp,ncomp);
  (this->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab =
       (_func_int **)&PTR__EBCellFlagFab_008380a8;
  *(undefined4 *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 100;
  p_Var1 = &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EBCellFlagFab::EBCellFlagFab (const EBCellFlagFab& rhs,
                              MakeType make_type, int scomp, int ncomp)
    : BaseFab<EBCellFlag>(rhs,make_type,scomp,ncomp)
{}